

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          string *makefile,string *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string makefileName;
  string generator;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  paVar6 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)0x1;
  local_e0.field_2._M_local_buf[0] = 0x22;
  local_48 = (make->_M_dataplus)._M_p;
  local_50 = make->_M_string_length;
  local_60._M_len = 1;
  paVar1 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)0x1;
  local_90.field_2._M_local_buf[0] = '\"';
  local_40 = 1;
  views._M_len = 3;
  views._M_array = &local_60;
  local_e0._M_string_length = (size_type)paVar6;
  local_90._M_string_length = (size_type)paVar1;
  local_60._M_str = (char *)paVar6;
  local_38 = paVar1;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_60);
  iVar2 = std::__cxx11::string::compare((char *)&local_60);
  if (iVar2 == 0) {
    cmSystemTools::ConvertToOutputPath(&local_90,makefile);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    paVar6 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_90._M_dataplus._M_p,
               (char *)(local_90._M_string_length + (long)local_90._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_e0);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar6) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b0,", \"",target);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar3;
    }
    local_e0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_e0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)paVar6);
LAB_0039af79:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) goto LAB_0039af90;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar2 == 0) {
      cmSystemTools::ConvertToOutputPath(&local_90,makefile);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      paVar6 = &local_e0.field_2;
      local_e0._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_90._M_dataplus._M_p,
                 (char *)(local_90._M_string_length + (long)local_90._M_dataplus._M_p));
      std::__cxx11::string::append((char *)&local_e0);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar6) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_b0,", \"",target);
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
      psVar5 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_e0.field_2._M_allocated_capacity = *psVar5;
        local_e0.field_2._8_8_ = puVar4[3];
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar5;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar4;
      }
      local_e0._M_string_length = puVar4[1];
      *puVar4 = psVar5;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      local_e0._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)paVar6);
      goto LAB_0039af79;
    }
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar1;
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar2 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_90);
    }
    else {
      cmSystemTools::ConvertToOutputPath(&local_e0,makefile);
      std::__cxx11::string::operator=((string *)&local_90,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar6) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_e0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_90._M_dataplus._M_p,
               (char *)(local_90._M_string_length + (long)local_90._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_e0);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar6) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_b0,", \"",target);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_b0);
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0.field_2._8_8_ = puVar4[3];
      local_e0._M_dataplus._M_p = (pointer)paVar6;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_e0._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_e0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar6) goto LAB_0039af90;
  }
  operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
LAB_0039af90:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((size_type *)local_60._M_len != &local_50) {
    operator_delete((void *)local_60._M_len,local_50 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
  const std::string& make, const std::string& makefile,
  const std::string& target)
{
  std::string command = cmStrCat('"', make, '"');
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "/NOLOGO", "/f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else if (generator == "Ninja") {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  } else {
    std::string makefileName;
    if (generator == "MinGW Makefiles") {
      // no escaping of spaces in this case, see
      // https://gitlab.kitware.com/cmake/cmake/-/issues/10014
      makefileName = makefile;
    } else {
      makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    }
    command += R"(, "-f", ")";
    command += makefileName + "\"";
    command += ", \"" + target + "\"";
  }
  return command;
}